

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O1

QSize __thiscall QWidgetItem::maximumSize(QWidgetItem *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QSize QVar4;
  QSize QVar5;
  
  iVar3 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar3 == '\0') {
    bVar2 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (bVar2) {
      QVar4 = qSmartMaxSize(this,(Alignment)
                                 (this->super_QLayoutItem).align.
                                 super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i);
      return QVar4;
    }
    lVar1 = *(long *)&this->wid->field_0x8;
    QVar4 = qSmartMaxSize(this,(Alignment)
                               (this->super_QLayoutItem).align.
                               super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                               super_QFlagsStorage<Qt::AlignmentFlag>.i);
    QVar5.wd.m_i = QVar4.wd.m_i.m_i + (int)*(char *)(lVar1 + 0x1a0) + (int)*(char *)(lVar1 + 0x1a2);
    QVar5.ht.m_i = QVar4.ht.m_i.m_i + (int)*(char *)(lVar1 + 0x1a1) + (int)*(char *)(lVar1 + 0x1a3);
  }
  else {
    QVar5.wd.m_i = 0;
    QVar5.ht.m_i = 0;
  }
  return QVar5;
}

Assistant:

QSize QWidgetItem::maximumSize() const
{
    if (isEmpty()) {
        return QSize(0, 0);
    } else {
        return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
               ? toLayoutItemSize(wid->d_func(), qSmartMaxSize(this, align))
               : qSmartMaxSize(this, align);
    }
}